

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkFunctionReturns(CheckerVisitor *this,FunctionDecl *func)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  SQCompilation *this_00;
  char *pcVar5;
  int32_t id;
  FunctionReturnTypeEvaluator local_38;
  
  if (this->effectsOnly == false) {
    this_00 = (SQCompilation *)func->_name;
    if ((this_00 == (SQCompilation *)0x0) || (*this_00 == (SQCompilation)0x28)) {
      this_00 = (SQCompilation *)findSlotNameInStack(this,&func->super_Decl);
    }
    local_38.flags = 0;
    local_38.checker = this;
    bVar3 = FunctionReturnTypeEvaluator::checkNode(&local_38,(Statement *)func->_body);
    uVar2 = local_38.flags;
    bVar3 = !bVar3;
    bVar1 = 0;
    if ((this_00 != (SQCompilation *)0x0) &&
       (bVar1 = 0, bVar3 || (local_38.flags & 0xfffffcf9) != 0)) {
      bVar4 = hasAnyPrefix(this_00,SQCompilationContext::
                                   function_should_return_bool_prefix_abi_cxx11_,DAT_001a8040);
      if (bVar4) {
        report(this,(Node *)func,0x5a,this_00);
        bVar1 = 1;
      }
      else {
        bVar1 = 0;
      }
    }
    if ((uVar2 & 0xef8) != 0 && (bVar3 || (uVar2 & 1) != 0)) {
      if ((uVar2 >> 10 & 1) == 0) {
        id = 0x4e;
LAB_001562d9:
        report(this,(Node *)func,id);
        return;
      }
    }
    else if (bVar3 || uVar2 != 0) {
      if ((uVar2 & 0xfffff8fc & (uVar2 & 0xfffff8fc) - 1) != 0) {
        id = 0x4f;
        goto LAB_001562d9;
      }
      if (!(bool)(this_00 == (SQCompilation *)0x0 | bVar1) && (bVar3 || (uVar2 & 1) != 0)) {
        bVar3 = hasAnyPrefix(this_00,SQCompilationContext::
                                     function_should_return_bool_prefix_abi_cxx11_,DAT_001a8040);
        if ((!bVar3) &&
           (bVar3 = hasAnyPrefix(this_00,SQCompilationContext::
                                         function_should_return_something_prefix_abi_cxx11_,
                                 DAT_001a8058), !bVar3)) {
          pcVar5 = strstr((char *)this_00,"_ctor");
          if ((pcVar5 == (char *)0x0) &&
             (pcVar5 = strstr((char *)this_00,"Ctor"), pcVar5 == (char *)0x0)) {
            return;
          }
          if (((*this_00 == (SQCompilation)0x73) && (this_00[1] == (SQCompilation)0x65)) &&
             (this_00[2] == (SQCompilation)0x74)) {
            return;
          }
        }
        report(this,(Node *)func,0x67,this_00);
        return;
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkFunctionReturns(FunctionDecl *func) {
  if (effectsOnly)
    return;

  const SQChar *name = func->name();

  if (!name || name[0] == '(') {
    name = findSlotNameInStack(func);
  }

  bool dummy;
  unsigned returnFlags = FunctionReturnTypeEvaluator(this).compute(func->body(), dummy);

  bool reported = false;

  if (returnFlags & ~(RT_BOOL | RT_UNRECOGNIZED | RT_FUNCTION_CALL | RT_NULL)) { // Null is castable to boolean
    if (nameLooksLikeResultMustBeBoolean(name)) {
      report(func, DiagnosticsId::DI_NAME_RET_BOOL, name);
      reported = true;
    }
  }

  if (!!(returnFlags & RT_NOTHING) &&
    !!(returnFlags & (RT_NUMBER | RT_STRING | RT_TABLE | RT_CLASS | RT_ARRAY | RT_CLOSURE | RT_UNRECOGNIZED | RT_THROW)))
  {
    if ((returnFlags & RT_THROW) == 0)
      report(func, DiagnosticsId::DI_NOT_ALL_PATH_RETURN_VALUE);
    reported = true;
  }
  else if (returnFlags)
  {
    unsigned flagsDiff = returnFlags & ~(RT_THROW | RT_NOTHING | RT_NULL | RT_UNRECOGNIZED | RT_FUNCTION_CALL);
    if (flagsDiff)
    {
      bool powerOfTwo = !(flagsDiff & (flagsDiff - 1));
      if (!powerOfTwo)
      {
        report(func, DiagnosticsId::DI_RETURNS_DIFFERENT_TYPES);
        reported = true;
      }
    }
  }

  if (!reported) {
    if (!!(returnFlags & RT_NOTHING) && nameLooksLikeFunctionMustReturnResult(name)) {
      report(func, DiagnosticsId::DI_NAME_EXPECTS_RETURN, name);
    }
  }
}